

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void HFSubWorker::workerthreadController(zsock_t *pipe,void *args)

{
  zsock_t *self_00;
  char *format;
  void *in_RSI;
  zsock_t *in_RDI;
  zloop_t *loop;
  zsock_t *pull;
  HFSubWorker *self;
  zloop_t *local_28;
  zsock_t *local_20;
  void *local_18;
  void *local_10;
  zsock_t *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  zsock_signal(in_RDI,'\0');
  local_18 = local_10;
  self_00 = zsock_new_checked(7,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                              ,0x1a6);
  local_20 = self_00;
  format = (char *)std::__cxx11::string::c_str();
  zsock_connect(self_00,format,0);
  local_28 = zloop_new();
  zloop_reader(local_28,local_20,pulltocallback,local_18);
  zloop_reader(local_28,local_8,HighFreqSub::pipeController,local_18);
  zloop_start(local_28);
  zsock_destroy_checked
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
             ,0x1ac);
  zloop_destroy(&local_28);
  return;
}

Assistant:

void HFSubWorker::workerthreadController(zsock_t *pipe, void *args){
    zsock_signal(pipe, 0);
    HFSubWorker *self = (HFSubWorker*)args;
    zsock_t *pull = zsock_new(ZMQ_PULL);
    zsock_connect(pull, self->pullendpoint.c_str(), NULL);
    zloop_t *loop = zloop_new();
    zloop_reader(loop, pull, pulltocallback, self);
    zloop_reader(loop, pipe, pipeController, self);
    zloop_start(loop);
    zsock_destroy(&pull);
    zloop_destroy(&loop);
}